

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  char *pcVar1;
  string currentBinDir;
  string currentSrcDir;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,"CMAKE_CURRENT_SOURCE_DIR",(allocator *)&local_88);
  pcVar1 = GetDefinition(this,&local_48);
  std::__cxx11::string::string((string *)&local_28,pcVar1,(allocator *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_88,"CMAKE_CURRENT_BINARY_DIR",(allocator *)&local_68);
  pcVar1 = GetDefinition(this,&local_88);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_8a);
  std::__cxx11::string::~string((string *)&local_88);
  InitializeFromParent(this);
  std::__cxx11::string::string((string *)&local_88,"CMAKE_SOURCE_DIR",&local_8a);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)&local_68,pcVar1,&local_89);
  SetDefinition(this,&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"CMAKE_BINARY_DIR",&local_8a);
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)&local_68,pcVar1,&local_89);
  SetDefinition(this,&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_88,"CMAKE_CURRENT_SOURCE_DIR",(allocator *)&local_68);
  SetDefinition(this,&local_88,&local_28);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_88,"CMAKE_CURRENT_BINARY_DIR",(allocator *)&local_68);
  SetDefinition(this,&local_88,&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}